

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  uint local_58;
  int32_t offsetS;
  int32_t offsetM;
  int32_t offsetH;
  uint local_48;
  int32_t tmpS;
  int32_t tmpM;
  int32_t tmpH;
  int *local_38;
  
  *parsedLen = 0;
  offsetS = 0;
  offsetM = 0;
  offsetH = 0;
  puVar3 = &PARSE_GMT_OFFSET_TYPES;
  local_58 = 1;
  iVar1 = 0;
  local_38 = parsedLen;
  for (lVar4 = 0; lVar4 != -6; lVar4 = lVar4 + -1) {
    iVar1 = parseOffsetFieldsWithPattern
                      (this,text,start,this->fGMTOffsetPatternItems[*puVar3],'\0',&offsetH,&offsetM,
                       &offsetS);
    if (0 < iVar1) {
      if (((int)lVar4 != -2) && ((int)lVar4 != -4)) {
        local_58 = -(uint)(lVar4 != 0) | 1;
      }
      break;
    }
    puVar3 = puVar3 + 1;
  }
  if ((0 < iVar1) && (this->fAbuttingOffsetHoursAndMinutes != '\0')) {
    tmpH = 0;
    tmpM = 0;
    tmpS = 0;
    puVar3 = &PARSE_GMT_OFFSET_TYPES;
    local_48 = 1;
    iVar2 = 0;
    for (lVar4 = 0; lVar4 != -6; lVar4 = lVar4 + -1) {
      iVar2 = parseOffsetFieldsWithPattern
                        (this,text,start,this->fGMTOffsetPatternItems[*puVar3],'\x01',&tmpH,&tmpM,
                         &tmpS);
      if (0 < iVar2) {
        if (((int)lVar4 != -2) && ((int)lVar4 != -4)) {
          local_48 = -(uint)(lVar4 != 0) | 1;
        }
        break;
      }
      puVar3 = puVar3 + 1;
    }
    if (iVar1 < iVar2) {
      offsetH = tmpH;
      offsetM = tmpM;
      offsetS = tmpS;
      local_58 = local_48;
      iVar1 = iVar2;
    }
  }
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = local_58 * ((offsetH * 0x3c + offsetM) * 0x3c + offsetS) * 1000;
    *local_38 = iVar1;
  }
  return iVar2;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFields(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t outLen = 0;
    int32_t offset = 0;
    int32_t sign = 1;

    parsedLen = 0;

    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;

    for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
        int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
        UVector* items = fGMTOffsetPatternItems[gmtPatType];
        U_ASSERT(items != NULL);

        outLen = parseOffsetFieldsWithPattern(text, start, items, FALSE, offsetH, offsetM, offsetS);
        if (outLen > 0) {
            sign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                1 : -1;
            break;
        }
    }

    if (outLen > 0 && fAbuttingOffsetHoursAndMinutes) {
        // When hours field is sabutting minutes field,
        // the parse result above may not be appropriate.
        // For example, "01020" is parsed as 01:02: above,
        // but it should be parsed as 00:10:20.
        int32_t tmpLen = 0;
        int32_t tmpSign = 1;
        int32_t tmpH = 0;
        int32_t tmpM = 0;
        int32_t tmpS = 0;

        for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
            int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
            UVector* items = fGMTOffsetPatternItems[gmtPatType];
            U_ASSERT(items != NULL);

            // forcing parse to use single hour digit
            tmpLen = parseOffsetFieldsWithPattern(text, start, items, TRUE, tmpH, tmpM, tmpS);
            if (tmpLen > 0) {
                tmpSign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                    1 : -1;
                break;
            }
        }
        if (tmpLen > outLen) {
            // Better parse result with single hour digit
            outLen = tmpLen;
            sign = tmpSign;
            offsetH = tmpH;
            offsetM = tmpM;
            offsetS = tmpS;
        }
    }

    if (outLen > 0) {
        offset = ((((offsetH * 60) + offsetM) * 60) + offsetS) * 1000 * sign;
        parsedLen = outLen;
    }

    return offset;
}